

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Reflector.h
# Opt level: O3

Matrix<60,_60> __thiscall
singular::Reflector<60>::applyFromRightTo<60>(Reflector<60> *this,Matrix<60,_60> *m)

{
  double *pdVar1;
  void *__src;
  double *pdVar2;
  double *pdVar3;
  pointer __dest;
  undefined8 *in_RDX;
  long lVar4;
  long lVar5;
  long lVar6;
  double *pdVar7;
  long lVar8;
  double *pdVar9;
  long lVar10;
  double dVar11;
  
  __dest = (pointer)operator_new__(0x7080);
  __src = (void *)*in_RDX;
  memmove(__dest,__src,0x7080);
  (this->u).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = __dest;
  pdVar2 = m->pBlock;
  pdVar3 = m[1].pBlock;
  lVar4 = ((long)pdVar2 - (long)pdVar3) * 0x20000000 + 0x3c00000000;
  if ((ulong)(lVar4 >> 0x20) < 0x3d) {
    lVar4 = lVar4 >> 0x1d;
    lVar10 = (long)__src + lVar4;
    lVar4 = (long)__dest + lVar4;
    pdVar1 = m[3].pBlock;
    lVar5 = 0;
    lVar6 = lVar10;
    do {
      if (pdVar2 != pdVar3) {
        pdVar7 = (double *)(lVar5 * 0x1e0 + lVar10);
        dVar11 = 0.0;
        pdVar9 = pdVar2;
        do {
          dVar11 = dVar11 + *pdVar9 * *pdVar7;
          pdVar9 = pdVar9 + 1;
          pdVar7 = pdVar7 + 1;
        } while (pdVar9 != pdVar3);
        lVar8 = 0;
        do {
          pdVar9 = (double *)((long)pdVar2 + lVar8);
          *(double *)(lVar4 + lVar8) =
               *pdVar9 * -dVar11 * (double)pdVar1 + *(double *)(lVar6 + lVar8);
          lVar8 = lVar8 + 8;
        } while (pdVar9 + 1 != pdVar3);
      }
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 0x1e0;
      lVar6 = lVar6 + 0x1e0;
    } while (lVar5 != 0x3c);
    return (Matrix<60,_60>)(double *)this;
  }
  __assert_fail("start >= 0 && start <= this->size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kikuomax[P]singular/src/singular/Vector.h"
                ,0x12a,
                "Vector<T> singular::Vector<const double>::slice(size_t) const [T = const double]");
}

Assistant:

Matrix< M, L > applyFromRightTo(const Matrix< M, L >& m) const {
			// m * H = m - m * gamma * u * u^T
			Matrix< M, L > m2 = m.clone();
			int offset = L - u.size();
			for (int i = 0; i < M; ++i) {
				// caches gamma * m * u
				Vector< const double > srcRow = m.row(i).slice(offset);
				double gMU = std::inner_product(
					this->u.begin(), this->u.end(), srcRow.begin(), 0.0);
				gMU *= this->gamma;
				// m * H = m - gMU * u^T
				Vector< double > dstRow = m2.row(i).slice(offset);
				std::transform(
					this->u.begin(), this->u.end(), srcRow.begin(),
					dstRow.begin(),
					[gMU](double a, double b) {
						return b - gMU * a;
					});
			}
			return m2;
		}